

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  uint uVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  byte *pbVar8;
  stbi_uc *psVar9;
  char *pcVar10;
  int i;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int sizes [16];
  uint local_78 [18];
  int iVar7;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar6 = stbi__get16be(z->s);
      iVar16 = uVar6 - 2;
      if (2 < uVar6) {
        do {
          psVar2 = z->s;
          pbVar8 = psVar2->img_buffer;
          if (pbVar8 < psVar2->img_buffer_end) {
LAB_00347ca6:
            psVar2->img_buffer = pbVar8 + 1;
            bVar4 = *pbVar8;
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar2);
              pbVar8 = psVar2->img_buffer;
              goto LAB_00347ca6;
            }
            bVar4 = 0;
          }
          if ((0x1f < bVar4) || (bVar15 = bVar4 & 0xf, 3 < bVar15)) {
            pcVar10 = "bad DHT header";
            goto LAB_00347fa2;
          }
          lVar17 = 0;
          uVar6 = 0;
          do {
            psVar2 = z->s;
            pbVar8 = psVar2->img_buffer;
            if (pbVar8 < psVar2->img_buffer_end) {
LAB_00347cfe:
              psVar2->img_buffer = pbVar8 + 1;
              uVar12 = (uint)*pbVar8;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                pbVar8 = psVar2->img_buffer;
                goto LAB_00347cfe;
              }
              uVar12 = 0;
            }
            local_78[lVar17] = uVar12;
            uVar6 = uVar6 + uVar12;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x10);
          if (bVar4 < 0x10) {
            iVar7 = stbi__build_huffman(z->huff_dc + bVar15,(int *)local_78);
            lVar17 = 8;
          }
          else {
            iVar7 = stbi__build_huffman(z->huff_ac + bVar15,(int *)local_78);
            lVar17 = 0x1a48;
          }
          if (iVar7 == 0) goto LAB_00347fab;
          if (uVar6 != 0) {
            uVar11 = 0;
            do {
              psVar2 = z->s;
              psVar9 = psVar2->img_buffer;
              if (psVar9 < psVar2->img_buffer_end) {
LAB_00347dbd:
                psVar2->img_buffer = psVar9 + 1;
                sVar3 = *psVar9;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar9 = psVar2->img_buffer;
                  goto LAB_00347dbd;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar15].values[uVar11 + lVar17 + -8] = sVar3;
              uVar11 = uVar11 + 1;
            } while (uVar6 != uVar11);
          }
          if (0xf < bVar4) {
            lVar17 = 0;
            do {
              uVar11 = (ulong)z->huff_ac[bVar15].fast[lVar17];
              z->fast_ac[bVar15][lVar17] = 0;
              if (uVar11 != 0xff) {
                bVar4 = z->huff_ac[bVar15].values[uVar11];
                uVar12 = bVar4 & 0xf;
                if ((bVar4 & 0xf) != 0) {
                  uVar13 = (uint)z->huff_ac[bVar15].size[uVar11];
                  uVar1 = uVar12 + uVar13;
                  if (uVar1 < 10) {
                    uVar14 = (int)lVar17 << (uVar13 & 0x1f) & 0x1ff;
                    uVar13 = -1 << uVar12 | 1;
                    if (0xff < uVar14) {
                      uVar13 = 0;
                    }
                    iVar7 = uVar13 + (uVar14 >> ((byte)(9 - (char)uVar12) & 0x1f));
                    if ((char)iVar7 == iVar7) {
                      z->fast_ac[bVar15][lVar17] =
                           (short)iVar7 * 0x100 | bVar4 & 0xfff0 | (ushort)uVar1;
                    }
                  }
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x200);
          }
          iVar16 = (iVar16 + -0x11) - uVar6;
        } while (0 < iVar16);
      }
    }
    else {
      if (m != 0xdb) {
LAB_00347bfa:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          uVar6 = stbi__get16be(z->s);
          if (1 < uVar6) {
            if (uVar6 < 7 || m != 0xe0) {
              if (uVar6 < 0xe || m != 0xee) {
                iVar16 = uVar6 - 2;
              }
              else {
                bVar18 = true;
                lVar17 = 0;
                do {
                  psVar2 = z->s;
                  psVar9 = psVar2->img_buffer;
                  if (psVar9 < psVar2->img_buffer_end) {
LAB_00348004:
                    psVar2->img_buffer = psVar9 + 1;
                    sVar3 = *psVar9;
                  }
                  else {
                    if (psVar2->read_from_callbacks != 0) {
                      stbi__refill_buffer(psVar2);
                      psVar9 = psVar2->img_buffer;
                      goto LAB_00348004;
                    }
                    sVar3 = '\0';
                  }
                  if (sVar3 != "Adobe"[lVar17]) {
                    bVar18 = false;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 6);
                if (bVar18) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar4 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar4;
                  iVar16 = uVar6 - 0xe;
                }
                else {
                  iVar16 = uVar6 - 8;
                }
              }
            }
            else {
              bVar18 = true;
              lVar17 = 0;
              do {
                psVar2 = z->s;
                psVar9 = psVar2->img_buffer;
                if (psVar9 < psVar2->img_buffer_end) {
LAB_00347f58:
                  psVar2->img_buffer = psVar9 + 1;
                  sVar3 = *psVar9;
                }
                else {
                  if (psVar2->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar2);
                    psVar9 = psVar2->img_buffer;
                    goto LAB_00347f58;
                  }
                  sVar3 = '\0';
                }
                if (sVar3 != "JFIF"[lVar17]) {
                  bVar18 = false;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 != 5);
              iVar16 = uVar6 - 7;
              if (bVar18) {
                z->jfif = 1;
              }
            }
            stbi__skip(z->s,iVar16);
            goto LAB_00348089;
          }
          if (m == 0xfe) {
            pcVar10 = "bad COM len";
          }
          else {
            pcVar10 = "bad APP len";
          }
        }
        else {
          pcVar10 = "unknown marker";
        }
        goto LAB_00347fa2;
      }
      uVar6 = stbi__get16be(z->s);
      iVar16 = uVar6 - 2;
      if (2 < uVar6) {
        do {
          psVar2 = z->s;
          pbVar8 = psVar2->img_buffer;
          if (pbVar8 < psVar2->img_buffer_end) {
LAB_00347b01:
            psVar2->img_buffer = pbVar8 + 1;
            bVar4 = *pbVar8;
            bVar18 = 0xf < bVar4;
            if ((bVar4 & 0xf0) != 0x10 && bVar18) {
              pcVar10 = "bad DQT type";
              goto LAB_00347fa2;
            }
            uVar6 = bVar4 & 0xf;
            if (3 < uVar6) {
              pcVar10 = "bad DQT table";
              goto LAB_00347fa2;
            }
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar2);
              pbVar8 = psVar2->img_buffer;
              goto LAB_00347b01;
            }
            bVar18 = false;
            uVar6 = 0;
          }
          lVar17 = 0;
          do {
            psVar2 = z->s;
            if (bVar18 == false) {
              pbVar8 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar8) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar5 = 0;
                  goto LAB_00347b91;
                }
                stbi__refill_buffer(psVar2);
                pbVar8 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar8 + 1;
              uVar5 = (ushort)*pbVar8;
            }
            else {
              iVar7 = stbi__get16be(psVar2);
              uVar5 = (ushort)iVar7;
            }
LAB_00347b91:
            pbVar8 = "" + lVar17;
            lVar17 = lVar17 + 1;
            *(ushort *)((long)z->dequant[0] + (ulong)*pbVar8 * 2 + (ulong)(uVar6 << 7)) = uVar5;
          } while (lVar17 != 0x40);
          iVar16 = (uint)(bVar18 ^ 1) * 0x40 + -0x81 + iVar16;
        } while (0 < iVar16);
      }
    }
    bVar18 = iVar16 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar16 = stbi__get16be(z->s);
      if (iVar16 == 4) {
        iVar16 = stbi__get16be(z->s);
        z->restart_interval = iVar16;
LAB_00348089:
        bVar18 = true;
        goto LAB_0034808b;
      }
      pcVar10 = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_00347bfa;
      pcVar10 = "expected marker";
    }
LAB_00347fa2:
    *(char **)(in_FS_OFFSET + -0x408) = pcVar10;
LAB_00347fab:
    bVar18 = false;
  }
LAB_0034808b:
  return (int)bVar18;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}